

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void glcts::ArraysOfArrays::initTests<glcts::ArraysOfArrays::Interface::ES>
               (TestCaseGroup *group,Context *context)

{
  TestNode *pTVar1;
  
  initializeMap<glcts::ArraysOfArrays::Interface::ES>();
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsPrimitive",
             " Verify that declarations of variables containing between 2 and 8\n sized dimensions of each primitive type are permitted.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138ac0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsStructTypes1",
             " Declare a structure type containing both ints and floats, and verify\n that variables having between 2 and 8 sized dimensions of this type\n can be declared.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138bd0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsStructTypes2",
             " Verify that a single declaration containing multiple\n variables with different numbers of array dimensions is accepted,\n e.g.  float [2][2] x2, x3[2], x4[2][2], etc) with each variable\n having between two and eight dimensions when there are\n declarations within the structure body.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138c58;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsStructTypes3",
             " Declare a structure type containing both ints and floats, and verify\n that variables having between 2 and 8 sized dimensions of this type\n can be declared, with a structure containing an array.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138ce0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsStructTypes4",
             " Declare a structure type containing an array, and verify\n that variables having between 2 and 8 sized dimensions of this type\n can be declared when the structure  definition is included in the \n variable definition.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138d68;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsTypenameStyle1",
             " Verify that an 8-dimensional array of floats can be declared with\n any placement of the brackets (e.g. float[2]\n x[2][2][2][2][2][2][2], float [2][2] x [2][2][2][2][2][2], etc) (9\n cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138df0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsTypenameStyle2",
             " Verify that a single declaration containing multiple\n variables with different numbers of array dimensions is accepted,\n e.g.  float [2][2] x2, x3[2], x4[2][2], etc) with each variable\n having between two and eight dimensions. Repeat these tests for\n declarations within a structure body.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138e78;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsTypenameStyle3",
             " Verify that a single declaration, within a structure body,\n is accepted when it contains multiple variables with different\n numbers of array dimensions, \n e.g.  float [2][2] x2, x3[2], x4[2][2], etc), with each variable\n having between two and eight dimensions.\n The variables should be declared within a structure body.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138f00;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsTypenameStyle4",
             " Verify that an 8-dimensional array of floats can be declared with\n any placement of the brackets (e.g. float[2]\n x[2][2][2][2][2][2][2], float [2][2] x [2][2][2][2][2][2], etc) (9\n cases) within a structure body.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02138f88;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsTypenameStyle5",
             " Verify that a single declaration containing multiple\n variables with different numbers of array dimensions is accepted,\n within a structure body\n e.g.  float [2][2] x2, x3[2], x4[2][2], etc) with each variable\n having between two and eight dimensions.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139010;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"SizedDeclarationsFunctionParams",
             " Declare a function having eight parameters, each a float array\n with a different number of dimensions between 1 and 8, and verify\n that the compiler accepts this. Declare a variable with matching\n shape for each parameter, and verify that the function can be\n called with these variables as arguments. Interchange each pair\n of arguments and verify that the shader is correctly rejected due\n to mismatched arguments (28 total cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139098;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"sized_declarations_invalid_sizes1",
             " Correctly reject variable declarations, having 4 dimensions, for\n which any combination of dimensions are declared with zero-size\n (16 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139120;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"sized_declarations_invalid_sizes2",
             " Correctly reject variable declarations, having 4 dimensions, for\n which any combination of dimensions are declared with size -1\n (16 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021391a8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"sized_declarations_invalid_sizes3",
             " Correctly reject variable declarations, having 4 dimensions, for\n which any combination of dimensions are declared with a\n non-constant (16 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139230;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"sized_declarations_invalid_sizes4",
             " Correctly reject modifications of a variable declaration of\n 4 dimensions (e.g. float x[2][2][2][2]), in which\n each adjacent pair \'][\' is replaced by the sequence operator\n (e.g. float x[2,2][2][2]) (6 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021392b8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclConstructors1",
             " Verifies that constructors for arrays of between 2 and 8 dimensions\n are accepted as isolated expressions for each non-opaque primitive\n type (7 cases per primitive type).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139340;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclConstructors2",
             " Correctly reject any attempt to pass arguments to a\n 2 dimensional float array constructor which has matching scalar\n count, but different array shape or dimensionality to the array\'s\n indexed type e.g. float[2][2](float[4](1,2,3,4)),\n float[2][2](float[1][4](float[4](1,2,3,4))) (2 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021393c8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclUnsizedConstructors",
             " Verifies that any of the array dimensions, or any combination of\n dimensions, may be omitted for a 4-dimensional float array\n constructor (the sizes on its nested constructors may be\n consistently omitted or present, and need not be manipulated\n between cases) (e.g. float[][][2][](float[][][](float[][] etc))\n (16 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139450;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclConst",
             " Verifies that multi-dimensional arrays can be declared as const\n using nested constructors to initialize inner dimensions\n e.g. const float[2][2] x = float[2][2](float[2](1,2),float[2](3,4)).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021394d8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclInvalidConstructors1",
             " Correctly reject any attempt to call array constructors for\n 2-dimensional arrays of any opaque type.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139560;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclInvalidConstructors2",
             " Correctly reject 3-dimensional int array constructor calls\n for which any dimension or combination of dimensions is\n given as zero (see sec(i) - 8 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021395e8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclInvalidConstructors3",
             " Correctly reject 3-dimensional int array constructor calls\n for which any dimension or combination of dimensions is\n given as -1 (see sec(i) - 8 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139670;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclInvalidConstructors4",
             " Correctly reject 3-dimensional int array constructor calls\n for which any dimension or combination of dimensions is\n given by a non-constant variable (8 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021396f8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclConstructorSizing1",
             " Verifies that arrays of 4 dimensions can be declared with any\n combination of dimension sizes omitted, provided a valid\n constructor is used as an initializer (15 cases per non-opaque\n primitive type).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139780;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclConstructorSizing2",
             " Verifies that a sequence of arrays from 2 to 8 dimensions can\n be declared in a single statement\n (e.g. float[] x=float[](4,5), y[]=float[][](float[](4)), z[][]...).\n The size of the dimensions should vary between the cases\n of this test (e.g. in the previous case, we have\n float x[2] and float y[1][1]).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139808;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclStructConstructors",
             " Declare a user type (struct) and verify that arrays of between 2\n and 8 dimensions can be declared without explicit sizes, and\n initialized from constructors (7 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139890;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclUnsizedArrays1",
             " Correctly reject unsized declarations of variables between 2 and 8\n dimensions for which an initializer is not present.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139918;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclUnsizedArrays2",
             " Correctly reject unsized declarations where some elements are\n lacking initializers (e.g. float[] x=float[](1), y).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021399a0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclUnsizedArrays3",
             " Correctly reject a declaration which initializes a\n multi-dimensional array from a matrix type,\n e.g. (float[][] x = mat4(0)).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139a28;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ConstructorsAndUnsizedDeclUnsizedArrays4",
             " Declare a user type containing an unsized array\n (e.g. struct foo { float[][] x; }) and verify that the shader is\n correctly rejected.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139ab0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsAssignment1",
             " Declare two variables of matching array size, having between 2 and\n 8 dimensions, and verify that the value of one can be assigned to\n the other without error (7 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139b38;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsAssignment2",
             " Correctly reject assignment of variables of differing numbers of array\n dimensions (between 1 and 4) to one another (6 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139bc0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsAssignment3",
             " Correctly reject assignment of variables of 4 dimensions and differing\n array size to one another, where all combinations of each dimension\n matching or not matching are tested (15 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139c48;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsTypeRestrictions1",
             " Declare two 2-dimensional arrays of a sampler type and verify that\n one cannot be assigned to the other.\n Repeat the test for each opaque type.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139cd0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsTypeRestrictions2",
             " For each opaque type, verify that structures containing \n two 2-dimensional arrays of that sampler type\n cannot be assigned to each other.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139d58;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingScalar1",
             " Assign to each scalar element of a 4 dimensional array\n float x[1][2][3][4] (24 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139de0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingScalar2",
             " Correctly reject indexing the array with any combination\n of indices given as -1 (15 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139e68;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingScalar3",
             " Correctly reject indexing the array with any combination\n of indices given as 4 (15 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139ef0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingScalar4",
             " Correctly reject any attempt to index a 4-dimensional array with\n any combination of missing array index expressions\n (e.g. x[][0][0][]) - (15 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139f78;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingArray1",
             " Assign to each dimension of an 8 dimensional, single-element array\n with an appropriate constructor (e.g. float\n x[1][1][1][1][1][1][1][1];\n x[0] = float[1][1][1][1][1][1][1](1);\n x[0][0] = etc) - (8 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a000;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingArray2",
             " Declare two 8 dimensional, single-element arrays, and assign to\n each dimension of one from the matching sub_scripting of the other\n (e.g. x[0] = y[0]; x[0][0] = y[0][0]; etc.) (8 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a088;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsIndexingArray3",
             " Correctly reject use of ivecn to index an n-dimensional array -\n e.g. float x[2][2][2][2]; x[ivec4(0)] = 1; (3 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a110;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsDynamicIndexing1",
             " Verifies that any mixture of constant, uniform and dynamic expressions\n can be used as the array index expression, in any combination, for\n each dimension of a 2 dimensional array (16 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a198;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsDynamicIndexing2",
             " Correctly reject any attempt to index 4-dimensional arrays of opaque\n types with any combination of non-constant expressions\n (e.g. x[0][y][0][y] etc for non-const y) - (15 cases per type).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a220;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsEquality1",
             " Verifies that two 4-dimensional arrays of matching primitive\n type can be correctly compared for equality and inequality, when\n they differ independently in each component or combination of\n components (e.g. x = float[][](float[](1,1), float[](1,1)); y =\n float[][](float[](2,1), float[](1,1)); return x == y;) - (16\n cases per primitive type).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a2a8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsEquality2",
             " Verifies that two 4-dimensional arrays of matching user (struct)\n types can be correctly compared for equality and inequality, when\n they differ independently in each component or combination of\n components - (16 cases per primitive type).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a330;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsLength1",
             " For a 4-dimensional array declared as int x[4][3][2][1], verify that\n x.length returns the integer 4, x[0].length the integer 3, and so\n forth (4 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a3b8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsLength2",
             " For a 4-dimensional array declared as int x[1][2][3][4], verify that\n x.length returns the integer 1, x[0].length the integer 2, and so\n forth (4 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a440;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsLength3",
             " Correctly reject any use of the length method on elements of a\n 4-dimensional array x[1][1][1][1] for which the index\n expression is omitted, e.g. x[].length, x[][].length etc (3 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a4c8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsInvalid1",
             " Correctly reject an assignment of a 2 dimensional\n array x[2][2] to a variable y of type mat2.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a550;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"ExpressionsInvalid2",
             " For 8-dimensional arrays x,y, correctly reject any attempt\n to apply the relational operators other than equality and\n inequality (4 cases per non-opaque primitive type).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a5d8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionFunctionCalls1",
             " Declare a function returning an 8-dimensional 64-element array as\n an out parameter, which places a unique integer in each\n element.\n Verifies that the values are returned as expected when this function\n is called.\n Repeat for the following primitive types: int, float,\n ivec2, ivec3, ivec4, vec2, vec3, vec4, mat2, mat3, mat4.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a660;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionFunctionCalls2",
             " Declare a function taking an inout parameter,\n which multiplies each element by a different prime.\n Verifies that the results after returning are again as expected.\n Repeat for the following primitive types: int, float,\n ivec2, ivec3, ivec4, vec2, vec3, vec4, mat2, mat3, mat4.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a6e8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionArgumentAliasing1",
             " Declare a function taking two 8-dimensional, 64-element parameters\n (e.g. void g(int x[2][2][2][2][2][2][2][2], int\n y[2][2][2][2][2][2][2][2]) and verify that after calling g(z,z),\n and overwriting x with a constant value, the original values of z\n are accessible through y.\n Repeat for float and mat4 types.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a770;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionArgumentAliasing2",
             " Declare a function taking two 8-dimensional, 64-element parameters\n (e.g. void g(int x[2][2][2][2][2][2][2][2], int\n y[2][2][2][2][2][2][2][2]) and verify that after calling g(z,z),\n and overwriting y with a constant value, the original values of z\n are accessible through x.\n Repeat for float and mat4 types.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a7f8;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionArgumentAliasing3",
             " Declare a function taking two 8-dimensional, 64-element parameters\n (e.g. void g(int x[2][2][2][2][2][2][2][2], int\n y[2][2][2][2][2][2][2][2]) and verify that after calling g(z,z),\n and overwriting y with a constant value, the original values of z\n are accessible through x, where x is an out parameter.\n Repeat for float and mat4 types.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a880;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionArgumentAliasing4",
             " Declare a function taking two 8-dimensional, 64-element parameters\n (e.g. void g(int x[2][2][2][2][2][2][2][2], int\n y[2][2][2][2][2][2][2][2]) and verify that after calling g(z,z),\n and overwriting x with a constant value, the original values of z\n are accessible through y, where y is an out parameter.\n Repeat for float and mat4 types.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a908;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionArgumentAliasing5",
             " Declare a function taking two 8-dimensional, 64-element parameters\n (e.g. void g(int x[2][2][2][2][2][2][2][2], int\n y[2][2][2][2][2][2][2][2]) and verify that after calling g(z,z),\n and overwriting y with a constant value, the original values of z\n are accessible through x, where x is an inout parameter.\n Repeat for float and mat4 types.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213a990;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionArgumentAliasing6",
             " Declare a function taking two 8-dimensional, 64-element parameters\n (e.g. void g(int x[2][2][2][2][2][2][2][2], int\n y[2][2][2][2][2][2][2][2]) and verify that after calling g(z,z),\n and overwriting x with a constant value, the original values of z\n are accessible through y, where y is an inout parameter.\n Repeat for float and mat4 types.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213aa18;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionUniforms1",
             " Declare a 4-dimensional uniform array and verify that it can be\n initialized with user data correctly using the API.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213aaa0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionUniforms2",
             " Correctly reject 4-dimensional uniform arrays with any unsized\n dimension, with or without an initializer (30 cases).\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213ab28;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionUniformBuffers1",
             " Declare a uniform block containing a 6-dimensional array and verify\n that the resulting shader compiles.\n Repeat for ints and uints.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213abb0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionUniformBuffers2",
             " Declare a 4-dimensional uniform float array x[2][2][2][2] within a\n uniform block, and verify that it can be initialized correctly with user\n data via the API.\n Repeat for ints and uints.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213ac38;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionUniformBuffers3",
             " Correctly reject 4-dimensional uniform arrays with a uniform block\n with any dimension unsized, with or without an initializer (30 cases).\n Repeat for ints and uints.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213acc0;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"InteractionInterfaceArrays",
             " Verifies that 2-dimensional arrays of all interface resources\n available to a shader stage are correctly rejected. This includes,\n where applicable, interface variables, interface blocks, and shader\n storage buffer objects.\n"
            );
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1[1].m_testCtx = (TestContext *)0x0;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].m_name._M_string_length + 4) = 0;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0213ad48;
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  return;
}

Assistant:

void initTests(TestCaseGroup& group, glcts::Context& context)
{
	// Set up the map
	ArraysOfArrays::initializeMap<API>();

	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsPrimitive<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle5<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedConstructors<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConst<API>(context));

	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructorSizing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructorSizing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclStructConstructors<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsTypeRestrictions1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsTypeRestrictions2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsEquality1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsEquality2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsInvalid1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsInvalid2<API>(context));

	group.addChild(new glcts::ArraysOfArrays::InteractionFunctionCalls1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionFunctionCalls2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing5<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing6<API>(context));

	group.addChild(new glcts::ArraysOfArrays::InteractionUniforms1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniforms2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionInterfaceArrays<API>(context));

	if (API::USE_STORAGE_BLOCK)
	{
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers3<API>(context));
	}

	if (API::USE_ATOMIC)
	{
		group.addChild(new glcts::ArraysOfArrays::AtomicDeclarationTest<API>(context));
		group.addChild(new glcts::ArraysOfArrays::AtomicUsageTest<API>(context));
	}

	if (API::USE_SUBROUTINE)
	{
		group.addChild(new glcts::ArraysOfArrays::SubroutineFunctionCalls1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineFunctionCalls2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing3<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing4<API>(context));
	}
}